

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall wasm::EffectAnalyzer::mergeIn(EffectAnalyzer *this,EffectAnalyzer *other)

{
  bool bVar1;
  reference puVar2;
  reference pNVar3;
  byte local_178;
  byte local_177;
  byte local_176;
  byte local_175;
  byte local_174;
  byte local_173;
  byte local_172;
  byte local_171;
  byte local_170;
  byte local_16f;
  byte local_16e;
  byte local_16d;
  byte local_16c;
  byte local_16b;
  byte local_16a;
  byte local_169;
  byte local_159;
  undefined1 local_148 [8];
  Name i_5;
  iterator __end2_5;
  iterator __begin2_5;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range2_5;
  undefined1 local_110 [8];
  Name i_4;
  iterator __end2_4;
  iterator __begin2_4;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range2_4;
  undefined1 local_d8 [8];
  Name i_3;
  iterator __end2_3;
  iterator __begin2_3;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range2_3;
  undefined1 local_a0 [8];
  Name i_2;
  iterator __end2_2;
  iterator __begin2_2;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range2_2;
  uint local_64;
  iterator iStack_60;
  uint i_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_1;
  uint local_34;
  iterator iStack_30;
  uint i;
  iterator __end2;
  iterator __begin2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  EffectAnalyzer *other_local;
  EffectAnalyzer *this_local;
  
  local_159 = 1;
  if ((this->branchesOut & 1U) == 0) {
    local_159 = other->branchesOut;
  }
  this->branchesOut = (bool)(local_159 & 1);
  local_169 = 1;
  if ((this->calls & 1U) == 0) {
    local_169 = other->calls;
  }
  this->calls = (bool)(local_169 & 1);
  local_16a = 1;
  if ((this->readsMemory & 1U) == 0) {
    local_16a = other->readsMemory;
  }
  this->readsMemory = (bool)(local_16a & 1);
  local_16b = 1;
  if ((this->writesMemory & 1U) == 0) {
    local_16b = other->writesMemory;
  }
  this->writesMemory = (bool)(local_16b & 1);
  local_16c = 1;
  if ((this->readsTable & 1U) == 0) {
    local_16c = other->readsTable;
  }
  this->readsTable = (bool)(local_16c & 1);
  local_16d = 1;
  if ((this->writesTable & 1U) == 0) {
    local_16d = other->writesTable;
  }
  this->writesTable = (bool)(local_16d & 1);
  local_16e = 1;
  if ((this->readsMutableStruct & 1U) == 0) {
    local_16e = other->readsMutableStruct;
  }
  this->readsMutableStruct = (bool)(local_16e & 1);
  local_16f = 1;
  if ((this->writesStruct & 1U) == 0) {
    local_16f = other->writesStruct;
  }
  this->writesStruct = (bool)(local_16f & 1);
  local_170 = 1;
  if ((this->readsArray & 1U) == 0) {
    local_170 = other->readsArray;
  }
  this->readsArray = (bool)(local_170 & 1);
  local_171 = 1;
  if ((this->writesArray & 1U) == 0) {
    local_171 = other->writesArray;
  }
  this->writesArray = (bool)(local_171 & 1);
  local_172 = 1;
  if ((this->trap & 1U) == 0) {
    local_172 = other->trap;
  }
  this->trap = (bool)(local_172 & 1);
  local_173 = 1;
  if ((this->implicitTrap & 1U) == 0) {
    local_173 = other->implicitTrap;
  }
  this->implicitTrap = (bool)(local_173 & 1);
  local_174 = 1;
  if ((this->trapsNeverHappen & 1U) == 0) {
    local_174 = other->trapsNeverHappen;
  }
  this->trapsNeverHappen = (bool)(local_174 & 1);
  local_175 = 1;
  if ((this->isAtomic & 1U) == 0) {
    local_175 = other->isAtomic;
  }
  this->isAtomic = (bool)(local_175 & 1);
  local_176 = 1;
  if ((this->throws_ & 1U) == 0) {
    local_176 = other->throws_;
  }
  this->throws_ = (bool)(local_176 & 1);
  local_177 = 1;
  if ((this->danglingPop & 1U) == 0) {
    local_177 = other->danglingPop;
  }
  this->danglingPop = (bool)(local_177 & 1);
  local_178 = 1;
  if ((this->mayNotReturn & 1U) == 0) {
    local_178 = other->mayNotReturn;
  }
  this->mayNotReturn = (bool)(local_178 & 1);
  __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     (&other->localsRead);
  iStack_30 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (&other->localsRead);
  while( true ) {
    bVar1 = std::operator!=(&__end2,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
    local_34 = *puVar2;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (&this->localsRead,&local_34);
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
  }
  __end2_1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (&other->localsWritten);
  iStack_60 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (&other->localsWritten);
  while( true ) {
    bVar1 = std::operator!=(&__end2_1,&stack0xffffffffffffffa0);
    if (!bVar1) break;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2_1);
    local_64 = *puVar2;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (&this->localsWritten,&local_64);
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2_1);
  }
  __end2_2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                       (&other->mutableGlobalsRead);
  i_2.super_IString.str._M_str =
       (char *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                         (&other->mutableGlobalsRead);
  while( true ) {
    bVar1 = std::operator!=(&__end2_2,(_Self *)&i_2.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar3 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2_2);
    local_a0 = (undefined1  [8])(pNVar3->super_IString).str._M_len;
    i_2.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
              (&this->mutableGlobalsRead,(value_type *)local_a0);
    std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2_2);
  }
  __end2_3 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                       (&other->globalsWritten);
  i_3.super_IString.str._M_str =
       (char *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                         (&other->globalsWritten);
  while( true ) {
    bVar1 = std::operator!=(&__end2_3,(_Self *)&i_3.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar3 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2_3);
    local_d8 = (undefined1  [8])(pNVar3->super_IString).str._M_len;
    i_3.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
              (&this->globalsWritten,(value_type *)local_d8);
    std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2_3);
  }
  __end2_4 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                       (&other->breakTargets);
  i_4.super_IString.str._M_str =
       (char *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                         (&other->breakTargets);
  while( true ) {
    bVar1 = std::operator!=(&__end2_4,(_Self *)&i_4.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar3 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2_4);
    local_110 = (undefined1  [8])(pNVar3->super_IString).str._M_len;
    i_4.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
              (&this->breakTargets,(value_type *)local_110);
    std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2_4);
  }
  __end2_5 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                       (&other->delegateTargets);
  i_5.super_IString.str._M_str =
       (char *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                         (&other->delegateTargets);
  while( true ) {
    bVar1 = std::operator!=(&__end2_5,(_Self *)&i_5.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar3 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2_5);
    local_148 = (undefined1  [8])(pNVar3->super_IString).str._M_len;
    i_5.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
              (&this->delegateTargets,(value_type *)local_148);
    std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2_5);
  }
  return;
}

Assistant:

void mergeIn(const EffectAnalyzer& other) {
    branchesOut = branchesOut || other.branchesOut;
    calls = calls || other.calls;
    readsMemory = readsMemory || other.readsMemory;
    writesMemory = writesMemory || other.writesMemory;
    readsTable = readsTable || other.readsTable;
    writesTable = writesTable || other.writesTable;
    readsMutableStruct = readsMutableStruct || other.readsMutableStruct;
    writesStruct = writesStruct || other.writesStruct;
    readsArray = readsArray || other.readsArray;
    writesArray = writesArray || other.writesArray;
    trap = trap || other.trap;
    implicitTrap = implicitTrap || other.implicitTrap;
    trapsNeverHappen = trapsNeverHappen || other.trapsNeverHappen;
    isAtomic = isAtomic || other.isAtomic;
    throws_ = throws_ || other.throws_;
    danglingPop = danglingPop || other.danglingPop;
    mayNotReturn = mayNotReturn || other.mayNotReturn;
    for (auto i : other.localsRead) {
      localsRead.insert(i);
    }
    for (auto i : other.localsWritten) {
      localsWritten.insert(i);
    }
    for (auto i : other.mutableGlobalsRead) {
      mutableGlobalsRead.insert(i);
    }
    for (auto i : other.globalsWritten) {
      globalsWritten.insert(i);
    }
    for (auto i : other.breakTargets) {
      breakTargets.insert(i);
    }
    for (auto i : other.delegateTargets) {
      delegateTargets.insert(i);
    }
  }